

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase471::run(TestCase471 *this)

{
  Builder value;
  Builder value_00;
  Builder value_01;
  Builder value_02;
  Builder value_03;
  Builder value_04;
  Builder value_05;
  Builder value_06;
  Builder value_07;
  Builder value_08;
  Builder value_09;
  Builder value_10;
  Builder value_11;
  Builder value_12;
  Builder value_13;
  Builder value_14;
  Builder value_15;
  Builder value_16;
  Builder value_17;
  Builder value_18;
  char *pcVar1;
  size_t sVar2;
  Branch *pBVar3;
  ulong uVar4;
  anon_union_8_2_eba6ea51_for_Type_5 aVar5;
  ListSchema LVar6;
  Reader value_19;
  Reader value_20;
  Reader value_21;
  Reader value_22;
  Reader value_23;
  Reader value_24;
  initializer_list<int> value_25;
  initializer_list<int> value_26;
  initializer_list<int> value_27;
  Builder l8;
  DebugComparison<const_char_(&)[149],_kj::String> _kjCondition;
  Builder root;
  Builder list;
  MallocMessageBuilder builder;
  undefined8 uVar7;
  char *pcVar8;
  SegmentBuilder *pSVar9;
  String *pSVar10;
  undefined2 *puVar11;
  byte *pbVar12;
  undefined8 uVar13;
  StringTree local_600;
  String local_5c8;
  undefined8 in_stack_fffffffffffffa50;
  WirePointer *pWVar14;
  undefined8 in_stack_fffffffffffffa58;
  undefined8 in_stack_fffffffffffffa60;
  SegmentBuilder *pSVar15;
  CapTableBuilder *pCVar16;
  CapTableBuilder *pCVar17;
  WirePointer *pWVar18;
  WirePointer *pWVar19;
  WirePointer *in_stack_fffffffffffffa80;
  WirePointer *pWVar20;
  char *in_stack_fffffffffffffa88;
  size_t in_stack_fffffffffffffa90;
  bool local_568;
  StructBuilder local_560;
  String local_538;
  undefined1 local_520 [40];
  char *local_4f8;
  ulong local_4f0;
  anon_union_8_2_eba6ea51_for_Type_5 aStack_4e8;
  SegmentBuilder *local_4e0;
  CapTableBuilder *pCStack_4d8;
  byte *local_4d0;
  WirePointer *pWStack_4c8;
  StructDataBitCount local_4c0;
  StructPointerCount SStack_4bc;
  ElementSize EStack_4ba;
  undefined1 uStack_4b9;
  ulong local_4b8;
  anon_union_8_2_eba6ea51_for_Type_5 aStack_4b0;
  SegmentBuilder *local_4a8;
  CapTableBuilder *pCStack_4a0;
  byte *local_498;
  WirePointer *pWStack_490;
  StructDataBitCount local_488;
  StructPointerCount SStack_484;
  ElementSize EStack_482;
  undefined1 uStack_481;
  undefined8 local_480;
  SegmentBuilder *pSStack_478;
  CapTableBuilder *pCStack_470;
  undefined2 *puStack_468;
  WirePointer *pWStack_460;
  StructDataBitCount local_458;
  StructPointerCount SStack_454;
  undefined2 uStack_452;
  undefined8 local_450;
  SegmentBuilder *pSStack_448;
  CapTableBuilder *pCStack_440;
  undefined2 *puStack_438;
  WirePointer *pWStack_430;
  StructDataBitCount local_428;
  StructPointerCount SStack_424;
  undefined2 uStack_422;
  undefined8 local_420;
  SegmentBuilder *pSStack_418;
  CapTableBuilder *pCStack_410;
  undefined2 *puStack_408;
  WirePointer *pWStack_400;
  StructDataBitCount local_3f8;
  StructPointerCount SStack_3f4;
  undefined2 uStack_3f2;
  undefined8 local_3f0;
  SegmentBuilder *pSStack_3e8;
  CapTableBuilder *pCStack_3e0;
  undefined2 *puStack_3d8;
  WirePointer *pWStack_3d0;
  StructDataBitCount local_3c8;
  StructPointerCount SStack_3c4;
  undefined2 uStack_3c2;
  undefined8 local_3c0;
  SegmentBuilder *pSStack_3b8;
  CapTableBuilder *pCStack_3b0;
  undefined2 *puStack_3a8;
  WirePointer *pWStack_3a0;
  StructDataBitCount local_398;
  StructPointerCount SStack_394;
  undefined2 uStack_392;
  undefined8 local_390;
  SegmentBuilder *pSStack_388;
  CapTableBuilder *pCStack_380;
  undefined2 *puStack_378;
  WirePointer *pWStack_370;
  StructDataBitCount local_368;
  StructPointerCount SStack_364;
  undefined2 uStack_362;
  undefined8 local_360;
  SegmentBuilder *pSStack_358;
  CapTableBuilder *pCStack_350;
  undefined2 *puStack_348;
  WirePointer *pWStack_340;
  StructDataBitCount local_338;
  StructPointerCount SStack_334;
  undefined2 uStack_332;
  undefined8 local_330;
  SegmentBuilder *pSStack_328;
  CapTableBuilder *pCStack_320;
  undefined2 *puStack_318;
  WirePointer *pWStack_310;
  StructDataBitCount local_308;
  StructPointerCount SStack_304;
  undefined2 uStack_302;
  undefined8 local_300;
  SegmentBuilder *pSStack_2f8;
  CapTableBuilder *pCStack_2f0;
  undefined2 *puStack_2e8;
  WirePointer *pWStack_2e0;
  StructDataBitCount local_2d8;
  StructPointerCount SStack_2d4;
  undefined2 uStack_2d2;
  undefined8 local_2d0;
  SegmentBuilder *pSStack_2c8;
  CapTableBuilder *pCStack_2c0;
  undefined2 *puStack_2b8;
  WirePointer *pWStack_2b0;
  StructDataBitCount local_2a8;
  StructPointerCount SStack_2a4;
  undefined2 uStack_2a2;
  undefined8 local_2a0;
  SegmentBuilder *pSStack_298;
  CapTableBuilder *pCStack_290;
  undefined2 *puStack_288;
  WirePointer *pWStack_280;
  StructDataBitCount local_278;
  StructPointerCount SStack_274;
  undefined2 uStack_272;
  undefined8 local_270;
  SegmentBuilder *pSStack_268;
  CapTableBuilder *pCStack_260;
  undefined2 *puStack_258;
  WirePointer *pWStack_250;
  StructDataBitCount local_248;
  StructPointerCount SStack_244;
  undefined2 uStack_242;
  undefined8 local_240;
  SegmentBuilder *pSStack_238;
  CapTableBuilder *pCStack_230;
  undefined2 *puStack_228;
  WirePointer *pWStack_220;
  StructDataBitCount local_218;
  StructPointerCount SStack_214;
  undefined2 uStack_212;
  undefined8 local_210;
  SegmentBuilder *pSStack_208;
  CapTableBuilder *pCStack_200;
  undefined2 *puStack_1f8;
  WirePointer *pWStack_1f0;
  StructDataBitCount local_1e8;
  StructPointerCount SStack_1e4;
  undefined2 uStack_1e2;
  undefined8 local_1e0;
  SegmentBuilder *pSStack_1d8;
  CapTableBuilder *pCStack_1d0;
  undefined2 *puStack_1c8;
  WirePointer *pWStack_1c0;
  StructDataBitCount local_1b8;
  StructPointerCount SStack_1b4;
  undefined2 uStack_1b2;
  undefined8 local_1b0;
  SegmentBuilder *pSStack_1a8;
  CapTableBuilder *pCStack_1a0;
  undefined2 *puStack_198;
  WirePointer *pWStack_190;
  StructDataBitCount local_188;
  StructPointerCount SStack_184;
  undefined2 uStack_182;
  undefined8 local_180;
  SegmentBuilder *pSStack_178;
  CapTableBuilder *pCStack_170;
  undefined2 *puStack_168;
  WirePointer *pWStack_160;
  StructDataBitCount local_158;
  StructPointerCount SStack_154;
  undefined2 uStack_152;
  undefined8 local_150;
  SegmentBuilder *pSStack_148;
  CapTableBuilder *pCStack_140;
  undefined2 *puStack_138;
  WirePointer *pWStack_130;
  StructDataBitCount local_128;
  StructPointerCount SStack_124;
  undefined2 uStack_122;
  MallocMessageBuilder local_120;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_120,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_600,&local_120.super_MessageBuilder);
  PointerBuilder::initStruct
            (&local_560,(PointerBuilder *)&stack0xfffffffffffffa68,(StructSize)0x20000);
  pWVar19 = local_560.pointers + 1;
  pSVar15 = local_560.segment;
  pCVar17 = local_560.capTable;
  PointerBuilder::initStructList
            ((ListBuilder *)local_520,(PointerBuilder *)&stack0xfffffffffffffa68,3,
             (StructSize)0x10001);
  ListBuilder::getStructElement
            ((StructBuilder *)&stack0xfffffffffffffa68,(ListBuilder *)local_520,0);
  (pWVar19->offsetAndKind).value = 0x7b;
  ListBuilder::getStructElement
            ((StructBuilder *)&stack0xfffffffffffffa68,(ListBuilder *)local_520,0);
  value_19.super_StringPtr.content.size_ = 4;
  value_19.super_StringPtr.content.ptr = "foo";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_600,value_19);
  ListBuilder::getStructElement
            ((StructBuilder *)&stack0xfffffffffffffa68,(ListBuilder *)local_520,1);
  (pWVar19->offsetAndKind).value = 0x1c8;
  ListBuilder::getStructElement
            ((StructBuilder *)&stack0xfffffffffffffa68,(ListBuilder *)local_520,1);
  value_20.super_StringPtr.content.size_ = 4;
  value_20.super_StringPtr.content.ptr = "bar";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_600,value_20);
  ListBuilder::getStructElement
            ((StructBuilder *)&stack0xfffffffffffffa68,(ListBuilder *)local_520,2);
  (pWVar19->offsetAndKind).value = 0x315;
  local_600.text.content.ptr = (char *)pCVar17;
  local_600.text.content.size_ = (size_t)in_stack_fffffffffffffa80;
  ListBuilder::getStructElement
            ((StructBuilder *)&stack0xfffffffffffffa68,(ListBuilder *)local_520,2);
  value_21.super_StringPtr.content.size_ = 4;
  value_21.super_StringPtr.content.ptr = "baz";
  pCVar16 = (CapTableBuilder *)local_600.text.content.ptr;
  pWVar14 = (WirePointer *)local_600.text.content.size_;
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_600,value_21);
  local_538.content.ptr =
       "( structList = [\n    (int32Field = 123, textField = \"foo\"),\n    (int32Field = 456, textField = \"bar\"),\n    (int32Field = 789, textField = \"baz\") ] )"
  ;
  pSStack_148 = local_560.segment;
  pCStack_140 = local_560.capTable;
  puStack_138 = (undefined2 *)local_560.data;
  pWStack_130 = local_560.pointers;
  local_128 = local_560.dataSize;
  SStack_124 = local_560.pointerCount;
  uStack_122 = local_560._38_2_;
  local_150 = 0x6ec888;
  uVar7 = 0x6ec888;
  value.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa58;
  value.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffa50;
  value.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa60;
  value.builder.data = pSVar15;
  value.builder.pointers = (WirePointer *)pCVar16;
  value.builder._32_8_ = pWVar19;
  pSVar9 = local_560.segment;
  pCVar17 = local_560.capTable;
  puVar11 = (undefined2 *)local_560.data;
  pWVar18 = local_560.pointers;
  uVar13 = local_560._32_8_;
  prettyPrint(value);
  kj::StringTree::flatten(&local_5c8,&local_600);
  kj::_::DebugExpression<char_const(&)[149]>::operator==
            ((DebugComparison<const_char_(&)[149],_kj::String> *)&stack0xfffffffffffffa68,
             (DebugExpression<char_const(&)[149]> *)&local_538,&local_5c8);
  sVar2 = local_5c8.content.size_;
  pcVar1 = local_5c8.content.ptr;
  if ((SegmentBuilder *)local_5c8.content.ptr != (SegmentBuilder *)0x0) {
    local_5c8.content.ptr = (char *)0x0;
    local_5c8.content.size_ = 0;
    (**(local_5c8.content.disposer)->_vptr_ArrayDisposer)
              (local_5c8.content.disposer,pcVar1,1,sVar2,sVar2,0,uVar7,pSVar9,pCVar17,puVar11,
               pWVar18,uVar13);
  }
  sVar2 = local_600.branches.size_;
  pBVar3 = local_600.branches.ptr;
  if (local_600.branches.ptr != (Branch *)0x0) {
    local_600.branches.ptr = (Branch *)0x0;
    local_600.branches.size_ = 0;
    (**(local_600.branches.disposer)->_vptr_ArrayDisposer)
              (local_600.branches.disposer,pBVar3,0x40,sVar2,sVar2,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar2 = local_600.text.content.size_;
  pcVar1 = local_600.text.content.ptr;
  if ((CapTableBuilder *)local_600.text.content.ptr != (CapTableBuilder *)0x0) {
    local_600.text.content.ptr = (char *)0x0;
    local_600.text.content.size_ = 0;
    (**(local_600.text.content.disposer)->_vptr_ArrayDisposer)
              (local_600.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((local_568 == false) && (kj::_::Debug::minSeverity < 3)) {
    pSStack_178 = local_560.segment;
    pCStack_170 = local_560.capTable;
    puStack_168 = (undefined2 *)local_560.data;
    pWStack_160 = local_560.pointers;
    local_158 = local_560.dataSize;
    SStack_154 = local_560.pointerCount;
    uStack_152 = local_560._38_2_;
    local_180 = 0x6ec888;
    value_00.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa58;
    value_00.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffa50;
    value_00.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa60;
    value_00.builder.data = pSVar15;
    value_00.builder.pointers = (WirePointer *)pCVar16;
    value_00.builder._32_8_ = pWVar19;
    pCVar17 = local_560.capTable;
    puVar11 = (undefined2 *)local_560.data;
    pWVar18 = local_560.pointers;
    uVar13 = local_560._32_8_;
    prettyPrint(value_00);
    pSVar10 = &local_5c8;
    kj::StringTree::flatten(pSVar10,&local_600);
    pcVar8 = 
    "( structList = [\n    (int32Field = 123, textField = \"foo\"),\n    (int32Field = 456, textField = \"bar\"),\n    (int32Field = 789, textField = \"baz\") ] )"
    ;
    kj::_::Debug::
    log<char_const(&)[221],kj::_::DebugComparison<char_const(&)[149],kj::String>&,char_const(&)[149],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x1ea,ERROR,
               "\"failed: expected \" \"(\\\"( structList = [\\\\n\\\" \\\"    (int32Field = 123, textField = \\\\\\\"foo\\\\\\\"),\\\\n\\\" \\\"    (int32Field = 456, textField = \\\\\\\"bar\\\\\\\"),\\\\n\\\" \\\"    (int32Field = 789, textField = \\\\\\\"baz\\\\\\\") ] )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( structList = [\\n\" \"    (int32Field = 123, textField = \\\"foo\\\"),\\n\" \"    (int32Field = 456, textField = \\\"bar\\\"),\\n\" \"    (int32Field = 789, textField = \\\"baz\\\") ] )\", prettyPrint(root).flatten()"
               ,(char (*) [221])
                "failed: expected (\"( structList = [\\n\" \"    (int32Field = 123, textField = \\\"foo\\\"),\\n\" \"    (int32Field = 456, textField = \\\"bar\\\"),\\n\" \"    (int32Field = 789, textField = \\\"baz\\\") ] )\") == (prettyPrint(root).flatten())"
               ,(DebugComparison<const_char_(&)[149],_kj::String> *)&stack0xfffffffffffffa68,
               (char (*) [149])
               "( structList = [\n    (int32Field = 123, textField = \"foo\"),\n    (int32Field = 456, textField = \"bar\"),\n    (int32Field = 789, textField = \"baz\") ] )"
               ,pSVar10);
    sVar2 = local_5c8.content.size_;
    pcVar1 = local_5c8.content.ptr;
    if ((SegmentBuilder *)local_5c8.content.ptr != (SegmentBuilder *)0x0) {
      local_5c8.content.ptr = (char *)0x0;
      local_5c8.content.size_ = 0;
      (**(local_5c8.content.disposer)->_vptr_ArrayDisposer)
                (local_5c8.content.disposer,pcVar1,1,sVar2,sVar2,0,pcVar8,pSVar10,pCVar17,puVar11,
                 pWVar18,uVar13);
    }
    sVar2 = local_600.branches.size_;
    pBVar3 = local_600.branches.ptr;
    if (local_600.branches.ptr != (Branch *)0x0) {
      local_600.branches.ptr = (Branch *)0x0;
      local_600.branches.size_ = 0;
      (**(local_600.branches.disposer)->_vptr_ArrayDisposer)
                (local_600.branches.disposer,pBVar3,0x40,sVar2,sVar2,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    }
    sVar2 = local_600.text.content.size_;
    pcVar1 = local_600.text.content.ptr;
    if ((CapTableBuilder *)local_600.text.content.ptr != (CapTableBuilder *)0x0) {
      local_600.text.content.ptr = (char *)0x0;
      local_600.text.content.size_ = 0;
      (**(local_600.text.content.disposer)->_vptr_ArrayDisposer)
                (local_600.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
    }
  }
  if (pCVar16 != (CapTableBuilder *)0x0) {
    (**(code **)*pWVar14)(pWVar14,pCVar16,1,pWVar19,pWVar19,0);
  }
  value_22.super_StringPtr.content.size_ = 4;
  value_22.super_StringPtr.content.ptr = "foo";
  pSVar15 = local_560.segment;
  pCVar16 = local_560.capTable;
  pWVar19 = local_560.pointers;
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&stack0xfffffffffffffa68,value_22);
  local_538.content.ptr =
       "( someText = \"foo\",\n  structList = [\n    (int32Field = 123, textField = \"foo\"),\n    (int32Field = 456, textField = \"bar\"),\n    (int32Field = 789, textField = \"baz\") ] )"
  ;
  pSStack_1a8 = local_560.segment;
  pCStack_1a0 = local_560.capTable;
  puStack_198 = (undefined2 *)local_560.data;
  pWStack_190 = local_560.pointers;
  local_188 = local_560.dataSize;
  SStack_184 = local_560.pointerCount;
  uStack_182 = local_560._38_2_;
  local_1b0 = 0x6ec888;
  uVar7 = 0x6ec888;
  value_01.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa58;
  value_01.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffa50;
  value_01.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa60;
  value_01.builder.data = pSVar15;
  value_01.builder.pointers = (WirePointer *)pCVar16;
  value_01.builder._32_8_ = pWVar19;
  pSVar9 = local_560.segment;
  pCVar17 = local_560.capTable;
  puVar11 = (undefined2 *)local_560.data;
  pWVar18 = local_560.pointers;
  uVar13 = local_560._32_8_;
  prettyPrint(value_01);
  kj::StringTree::flatten(&local_5c8,&local_600);
  kj::_::DebugExpression<char_const(&)[169]>::operator==
            ((DebugComparison<const_char_(&)[169],_kj::String> *)&stack0xfffffffffffffa68,
             (DebugExpression<char_const(&)[169]> *)&local_538,&local_5c8);
  sVar2 = local_5c8.content.size_;
  pcVar1 = local_5c8.content.ptr;
  if ((SegmentBuilder *)local_5c8.content.ptr != (SegmentBuilder *)0x0) {
    local_5c8.content.ptr = (char *)0x0;
    local_5c8.content.size_ = 0;
    (**(local_5c8.content.disposer)->_vptr_ArrayDisposer)
              (local_5c8.content.disposer,pcVar1,1,sVar2,sVar2,0,uVar7,pSVar9,pCVar17,puVar11,
               pWVar18,uVar13);
  }
  sVar2 = local_600.branches.size_;
  pBVar3 = local_600.branches.ptr;
  if (local_600.branches.ptr != (Branch *)0x0) {
    local_600.branches.ptr = (Branch *)0x0;
    local_600.branches.size_ = 0;
    (**(local_600.branches.disposer)->_vptr_ArrayDisposer)
              (local_600.branches.disposer,pBVar3,0x40,sVar2,sVar2,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar2 = local_600.text.content.size_;
  pcVar1 = local_600.text.content.ptr;
  if ((CapTableBuilder *)local_600.text.content.ptr != (CapTableBuilder *)0x0) {
    local_600.text.content.ptr = (char *)0x0;
    local_600.text.content.size_ = 0;
    (**(local_600.text.content.disposer)->_vptr_ArrayDisposer)
              (local_600.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((local_568 == false) && (kj::_::Debug::minSeverity < 3)) {
    pSStack_1d8 = local_560.segment;
    pCStack_1d0 = local_560.capTable;
    puStack_1c8 = (undefined2 *)local_560.data;
    pWStack_1c0 = local_560.pointers;
    local_1b8 = local_560.dataSize;
    SStack_1b4 = local_560.pointerCount;
    uStack_1b2 = local_560._38_2_;
    local_1e0 = 0x6ec888;
    value_02.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa58;
    value_02.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffa50;
    value_02.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa60;
    value_02.builder.data = pSVar15;
    value_02.builder.pointers = (WirePointer *)pCVar16;
    value_02.builder._32_8_ = pWVar19;
    pCVar17 = local_560.capTable;
    puVar11 = (undefined2 *)local_560.data;
    pWVar18 = local_560.pointers;
    uVar13 = local_560._32_8_;
    prettyPrint(value_02);
    pSVar10 = &local_5c8;
    kj::StringTree::flatten(pSVar10,&local_600);
    pcVar8 = 
    "( someText = \"foo\",\n  structList = [\n    (int32Field = 123, textField = \"foo\"),\n    (int32Field = 456, textField = \"bar\"),\n    (int32Field = 789, textField = \"baz\") ] )"
    ;
    kj::_::Debug::
    log<char_const(&)[247],kj::_::DebugComparison<char_const(&)[169],kj::String>&,char_const(&)[169],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,500,ERROR,
               "\"failed: expected \" \"(\\\"( someText = \\\\\\\"foo\\\\\\\",\\\\n\\\" \\\"  structList = [\\\\n\\\" \\\"    (int32Field = 123, textField = \\\\\\\"foo\\\\\\\"),\\\\n\\\" \\\"    (int32Field = 456, textField = \\\\\\\"bar\\\\\\\"),\\\\n\\\" \\\"    (int32Field = 789, textField = \\\\\\\"baz\\\\\\\") ] )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( someText = \\\"foo\\\",\\n\" \"  structList = [\\n\" \"    (int32Field = 123, textField = \\\"foo\\\"),\\n\" \"    (int32Field = 456, textField = \\\"bar\\\"),\\n\" \"    (int32Field = 789, textField = \\\"baz\\\") ] )\", prettyPrint(root).flatten()"
               ,(char (*) [247])
                "failed: expected (\"( someText = \\\"foo\\\",\\n\" \"  structList = [\\n\" \"    (int32Field = 123, textField = \\\"foo\\\"),\\n\" \"    (int32Field = 456, textField = \\\"bar\\\"),\\n\" \"    (int32Field = 789, textField = \\\"baz\\\") ] )\") == (prettyPrint(root).flatten())"
               ,(DebugComparison<const_char_(&)[169],_kj::String> *)&stack0xfffffffffffffa68,
               (char (*) [169])
               "( someText = \"foo\",\n  structList = [\n    (int32Field = 123, textField = \"foo\"),\n    (int32Field = 456, textField = \"bar\"),\n    (int32Field = 789, textField = \"baz\") ] )"
               ,pSVar10);
    sVar2 = local_5c8.content.size_;
    pcVar1 = local_5c8.content.ptr;
    if ((SegmentBuilder *)local_5c8.content.ptr != (SegmentBuilder *)0x0) {
      local_5c8.content.ptr = (char *)0x0;
      local_5c8.content.size_ = 0;
      (**(local_5c8.content.disposer)->_vptr_ArrayDisposer)
                (local_5c8.content.disposer,pcVar1,1,sVar2,sVar2,0,pcVar8,pSVar10,pCVar17,puVar11,
                 pWVar18,uVar13);
    }
    sVar2 = local_600.branches.size_;
    pBVar3 = local_600.branches.ptr;
    if (local_600.branches.ptr != (Branch *)0x0) {
      local_600.branches.ptr = (Branch *)0x0;
      local_600.branches.size_ = 0;
      (**(local_600.branches.disposer)->_vptr_ArrayDisposer)
                (local_600.branches.disposer,pBVar3,0x40,sVar2,sVar2,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    }
    sVar2 = local_600.text.content.size_;
    pcVar1 = local_600.text.content.ptr;
    if ((CapTableBuilder *)local_600.text.content.ptr != (CapTableBuilder *)0x0) {
      local_600.text.content.ptr = (char *)0x0;
      local_600.text.content.size_ = 0;
      (**(local_600.text.content.disposer)->_vptr_ArrayDisposer)
                (local_600.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
    }
  }
  if (pCVar16 != (CapTableBuilder *)0x0) {
    (**(code **)*pWVar14)(pWVar14,pCVar16,1,pWVar19,pWVar19,0);
  }
  MessageBuilder::getRootInternal((Builder *)&local_600,&local_120.super_MessageBuilder);
  PointerBuilder::initStruct
            (&local_560,(PointerBuilder *)&stack0xfffffffffffffa68,(StructSize)0xa0000);
  pWVar19 = local_560.pointers + 7;
  PointerBuilder::initList
            ((ListBuilder *)local_520,(PointerBuilder *)&stack0xfffffffffffffa68,POINTER,3);
  value_25._M_len = 4;
  value_25._M_array = (iterator)&stack0xfffffffffffffa68;
  List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Builder::set
            ((Builder *)local_520,0,value_25);
  value_26._M_len = 4;
  value_26._M_array = (iterator)&stack0xfffffffffffffa68;
  List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Builder::set
            ((Builder *)local_520,1,value_26);
  pSVar15 = (SegmentBuilder *)0x2a600000159;
  pCVar16 = (CapTableBuilder *)0x499602d200000390;
  value_27._M_len = 4;
  value_27._M_array = (iterator)&stack0xfffffffffffffa68;
  List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Builder::set
            ((Builder *)local_520,2,value_27);
  local_538.content.ptr =
       "[ [123, 456, 789, 1234567890],\n  [234, 567, 891, 1234567890],\n  [345, 678, 912, 1234567890] ]"
  ;
  LVar6 = ListSchema::of(INT32);
  aVar5 = LVar6.elementType.field_4;
  uVar4 = LVar6.elementType._0_8_ & 0xffffffffff00ffff |
          (ulong)(LVar6.elementType._0_4_ + 0x10000U & 0xff0000);
  local_488 = local_520._32_4_;
  SStack_484 = local_520._36_2_;
  EStack_482 = local_520[0x26];
  uStack_481 = local_520[0x27];
  local_498 = (byte *)local_520._16_8_;
  pWStack_490 = (WirePointer *)local_520._24_8_;
  local_4a8 = (SegmentBuilder *)local_520._0_8_;
  pCStack_4a0 = (CapTableBuilder *)local_520._8_8_;
  value_17.schema.elementType.field_4.schema = (RawBrandedSchema *)pSVar15;
  value_17.schema.elementType.baseType = (short)in_stack_fffffffffffffa60;
  value_17.schema.elementType.listDepth = (char)((ulong)in_stack_fffffffffffffa60 >> 0x10);
  value_17.schema.elementType.isImplicitParam =
       (bool)(char)((ulong)in_stack_fffffffffffffa60 >> 0x18);
  value_17.schema.elementType.field_3 =
       (anon_union_2_2_d12d5221_for_Type_3)(short)((ulong)in_stack_fffffffffffffa60 >> 0x20);
  value_17.schema.elementType._6_2_ = (short)((ulong)in_stack_fffffffffffffa60 >> 0x30);
  value_17.builder.segment = (SegmentBuilder *)pCVar16;
  value_17.builder.capTable = (CapTableBuilder *)pWVar19;
  value_17.builder.ptr = (byte *)pWVar14;
  value_17.builder._24_8_ = in_stack_fffffffffffffa88;
  value_17.builder.structDataSize = (int)in_stack_fffffffffffffa90;
  value_17.builder.structPointerCount = (short)(in_stack_fffffffffffffa90 >> 0x20);
  value_17.builder.elementSize = (char)(in_stack_fffffffffffffa90 >> 0x30);
  value_17.builder._39_1_ = (char)(in_stack_fffffffffffffa90 >> 0x38);
  pSVar9 = (SegmentBuilder *)local_520._0_8_;
  pCVar17 = (CapTableBuilder *)local_520._8_8_;
  pbVar12 = (byte *)local_520._16_8_;
  pWVar18 = (WirePointer *)local_520._24_8_;
  uVar13 = local_520._32_8_;
  local_4b8 = uVar4;
  aStack_4b0.scopeId = aVar5.scopeId;
  prettyPrint(value_17);
  kj::StringTree::flatten(&local_5c8,&local_600);
  kj::_::DebugExpression<char_const(&)[94]>::operator==
            ((DebugComparison<const_char_(&)[94],_kj::String> *)&stack0xfffffffffffffa68,
             (DebugExpression<char_const(&)[94]> *)&local_538,&local_5c8);
  sVar2 = local_5c8.content.size_;
  pcVar1 = local_5c8.content.ptr;
  if ((SegmentBuilder *)local_5c8.content.ptr != (SegmentBuilder *)0x0) {
    local_5c8.content.ptr = (char *)0x0;
    local_5c8.content.size_ = 0;
    (**(local_5c8.content.disposer)->_vptr_ArrayDisposer)
              (local_5c8.content.disposer,pcVar1,1,sVar2,sVar2,0,uVar4,aVar5.schema,pSVar9,pCVar17,
               pbVar12,pWVar18,uVar13);
  }
  sVar2 = local_600.branches.size_;
  pBVar3 = local_600.branches.ptr;
  if (local_600.branches.ptr != (Branch *)0x0) {
    local_600.branches.ptr = (Branch *)0x0;
    local_600.branches.size_ = 0;
    (**(local_600.branches.disposer)->_vptr_ArrayDisposer)
              (local_600.branches.disposer,pBVar3,0x40,sVar2,sVar2,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar2 = local_600.text.content.size_;
  pcVar1 = local_600.text.content.ptr;
  if ((CapTableBuilder *)local_600.text.content.ptr != (CapTableBuilder *)0x0) {
    local_600.text.content.ptr = (char *)0x0;
    local_600.text.content.size_ = 0;
    (**(local_600.text.content.disposer)->_vptr_ArrayDisposer)
              (local_600.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((local_568 == false) && (kj::_::Debug::minSeverity < 3)) {
    LVar6 = ListSchema::of(INT32);
    aStack_4e8 = LVar6.elementType.field_4;
    local_4f0 = LVar6.elementType._0_8_ & 0xffffffffff00ffff |
                (ulong)(LVar6.elementType._0_4_ + 0x10000U & 0xff0000);
    local_4c0 = local_520._32_4_;
    SStack_4bc = local_520._36_2_;
    EStack_4ba = local_520[0x26];
    uStack_4b9 = local_520[0x27];
    local_4d0 = (byte *)local_520._16_8_;
    pWStack_4c8 = (WirePointer *)local_520._24_8_;
    local_4e0 = (SegmentBuilder *)local_520._0_8_;
    pCStack_4d8 = (CapTableBuilder *)local_520._8_8_;
    value_18.schema.elementType.field_4.schema = (RawBrandedSchema *)pSVar15;
    value_18.schema.elementType.baseType = (short)in_stack_fffffffffffffa60;
    value_18.schema.elementType.listDepth = (char)((ulong)in_stack_fffffffffffffa60 >> 0x10);
    value_18.schema.elementType.isImplicitParam =
         (bool)(char)((ulong)in_stack_fffffffffffffa60 >> 0x18);
    value_18.schema.elementType.field_3 =
         (anon_union_2_2_d12d5221_for_Type_3)(short)((ulong)in_stack_fffffffffffffa60 >> 0x20);
    value_18.schema.elementType._6_2_ = (short)((ulong)in_stack_fffffffffffffa60 >> 0x30);
    value_18.builder.segment = (SegmentBuilder *)pCVar16;
    value_18.builder.capTable = (CapTableBuilder *)pWVar19;
    value_18.builder.ptr = (byte *)pWVar14;
    value_18.builder._24_8_ = in_stack_fffffffffffffa88;
    value_18.builder.structDataSize = (int)in_stack_fffffffffffffa90;
    value_18.builder.structPointerCount = (short)(in_stack_fffffffffffffa90 >> 0x20);
    value_18.builder.elementSize = (char)(in_stack_fffffffffffffa90 >> 0x30);
    value_18.builder._39_1_ = (char)(in_stack_fffffffffffffa90 >> 0x38);
    pSVar9 = (SegmentBuilder *)local_520._0_8_;
    pCVar17 = (CapTableBuilder *)local_520._8_8_;
    pWVar18 = (WirePointer *)local_520._24_8_;
    prettyPrint(value_18);
    pSVar10 = &local_5c8;
    kj::StringTree::flatten(pSVar10,&local_600);
    pcVar8 = 
    "[ [123, 456, 789, 1234567890],\n  [234, 567, 891, 1234567890],\n  [345, 678, 912, 1234567890] ]"
    ;
    kj::_::Debug::
    log<char_const(&)[154],kj::_::DebugComparison<char_const(&)[94],kj::String>&,char_const(&)[94],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x202,ERROR,
               "\"failed: expected \" \"(\\\"[ [123, 456, 789, 1234567890],\\\\n\\\" \\\"  [234, 567, 891, 1234567890],\\\\n\\\" \\\"  [345, 678, 912, 1234567890] ]\\\") == (prettyPrint(ll).flatten())\", _kjCondition, \"[ [123, 456, 789, 1234567890],\\n\" \"  [234, 567, 891, 1234567890],\\n\" \"  [345, 678, 912, 1234567890] ]\", prettyPrint(ll).flatten()"
               ,(char (*) [154])
                "failed: expected (\"[ [123, 456, 789, 1234567890],\\n\" \"  [234, 567, 891, 1234567890],\\n\" \"  [345, 678, 912, 1234567890] ]\") == (prettyPrint(ll).flatten())"
               ,(DebugComparison<const_char_(&)[94],_kj::String> *)&stack0xfffffffffffffa68,
               (char (*) [94])
               "[ [123, 456, 789, 1234567890],\n  [234, 567, 891, 1234567890],\n  [345, 678, 912, 1234567890] ]"
               ,pSVar10);
    sVar2 = local_5c8.content.size_;
    pcVar1 = local_5c8.content.ptr;
    if ((SegmentBuilder *)local_5c8.content.ptr != (SegmentBuilder *)0x0) {
      local_5c8.content.ptr = (char *)0x0;
      local_5c8.content.size_ = 0;
      (**(local_5c8.content.disposer)->_vptr_ArrayDisposer)
                (local_5c8.content.disposer,pcVar1,1,sVar2,sVar2,0,pcVar8,pSVar10,pSVar9,pCVar17,
                 local_520._16_8_,pWVar18,local_520._32_8_);
    }
    sVar2 = local_600.branches.size_;
    pBVar3 = local_600.branches.ptr;
    if (local_600.branches.ptr != (Branch *)0x0) {
      local_600.branches.ptr = (Branch *)0x0;
      local_600.branches.size_ = 0;
      (**(local_600.branches.disposer)->_vptr_ArrayDisposer)
                (local_600.branches.disposer,pBVar3,0x40,sVar2,sVar2,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    }
    sVar2 = local_600.text.content.size_;
    pcVar1 = local_600.text.content.ptr;
    if ((CapTableBuilder *)local_600.text.content.ptr != (CapTableBuilder *)0x0) {
      local_600.text.content.ptr = (char *)0x0;
      local_600.text.content.size_ = 0;
      (**(local_600.text.content.disposer)->_vptr_ArrayDisposer)
                (local_600.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
    }
  }
  pCVar17 = pCVar16;
  pWVar18 = pWVar19;
  if (pCVar16 != (CapTableBuilder *)0x0) {
    pCVar17 = (CapTableBuilder *)0x0;
    pWVar18 = (WirePointer *)0x0;
    (**(code **)*pWVar14)(pWVar14,pCVar16,1,pWVar19,pWVar19,0);
  }
  local_538.content.ptr =
       "( int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
  ;
  pSStack_208 = local_560.segment;
  pCStack_200 = local_560.capTable;
  puStack_1f8 = (undefined2 *)local_560.data;
  pWStack_1f0 = local_560.pointers;
  local_1e8 = local_560.dataSize;
  SStack_1e4 = local_560.pointerCount;
  uStack_1e2 = local_560._38_2_;
  local_210 = 0x6eba08;
  uVar7 = 0x6eba08;
  value_03.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa58;
  value_03.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffa50;
  value_03.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa60;
  value_03.builder.data = pSVar15;
  value_03.builder.pointers = (WirePointer *)pCVar17;
  value_03.builder._32_8_ = pWVar18;
  pSVar9 = local_560.segment;
  pCVar16 = local_560.capTable;
  puVar11 = (undefined2 *)local_560.data;
  pWVar19 = local_560.pointers;
  uVar13 = local_560._32_8_;
  prettyPrint(value_03);
  kj::StringTree::flatten(&local_5c8,&local_600);
  kj::_::DebugExpression<char_const(&)[122]>::operator==
            ((DebugComparison<const_char_(&)[122],_kj::String> *)&stack0xfffffffffffffa68,
             (DebugExpression<char_const(&)[122]> *)&local_538,&local_5c8);
  sVar2 = local_5c8.content.size_;
  pcVar1 = local_5c8.content.ptr;
  if ((SegmentBuilder *)local_5c8.content.ptr != (SegmentBuilder *)0x0) {
    local_5c8.content.ptr = (char *)0x0;
    local_5c8.content.size_ = 0;
    (**(local_5c8.content.disposer)->_vptr_ArrayDisposer)
              (local_5c8.content.disposer,pcVar1,1,sVar2,sVar2,0,uVar7,pSVar9,pCVar16,puVar11,
               pWVar19,uVar13);
  }
  sVar2 = local_600.branches.size_;
  pBVar3 = local_600.branches.ptr;
  if (local_600.branches.ptr != (Branch *)0x0) {
    local_600.branches.ptr = (Branch *)0x0;
    local_600.branches.size_ = 0;
    (**(local_600.branches.disposer)->_vptr_ArrayDisposer)
              (local_600.branches.disposer,pBVar3,0x40,sVar2,sVar2,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar2 = local_600.text.content.size_;
  pcVar1 = local_600.text.content.ptr;
  if ((CapTableBuilder *)local_600.text.content.ptr != (CapTableBuilder *)0x0) {
    local_600.text.content.ptr = (char *)0x0;
    local_600.text.content.size_ = 0;
    (**(local_600.text.content.disposer)->_vptr_ArrayDisposer)
              (local_600.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((local_568 == false) && (kj::_::Debug::minSeverity < 3)) {
    pSStack_238 = local_560.segment;
    pCStack_230 = local_560.capTable;
    puStack_228 = (undefined2 *)local_560.data;
    pWStack_220 = local_560.pointers;
    local_218 = local_560.dataSize;
    SStack_214 = local_560.pointerCount;
    uStack_212 = local_560._38_2_;
    local_240 = 0x6eba08;
    value_04.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa58;
    value_04.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffa50;
    value_04.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa60;
    value_04.builder.data = pSVar15;
    value_04.builder.pointers = (WirePointer *)pCVar17;
    value_04.builder._32_8_ = pWVar18;
    pCVar16 = local_560.capTable;
    puVar11 = (undefined2 *)local_560.data;
    pWVar19 = local_560.pointers;
    uVar13 = local_560._32_8_;
    prettyPrint(value_04);
    pSVar10 = &local_5c8;
    kj::StringTree::flatten(pSVar10,&local_600);
    pcVar8 = 
    "( int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
    ;
    kj::_::Debug::
    log<char_const(&)[188],kj::_::DebugComparison<char_const(&)[122],kj::String>&,char_const(&)[122],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x209,ERROR,
               "\"failed: expected \" \"(\\\"( int32ListList = [\\\\n\\\" \\\"    [123, 456, 789, 1234567890],\\\\n\\\" \\\"    [234, 567, 891, 1234567890],\\\\n\\\" \\\"    [345, 678, 912, 1234567890] ] )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( int32ListList = [\\n\" \"    [123, 456, 789, 1234567890],\\n\" \"    [234, 567, 891, 1234567890],\\n\" \"    [345, 678, 912, 1234567890] ] )\", prettyPrint(root).flatten()"
               ,(char (*) [188])
                "failed: expected (\"( int32ListList = [\\n\" \"    [123, 456, 789, 1234567890],\\n\" \"    [234, 567, 891, 1234567890],\\n\" \"    [345, 678, 912, 1234567890] ] )\") == (prettyPrint(root).flatten())"
               ,(DebugComparison<const_char_(&)[122],_kj::String> *)&stack0xfffffffffffffa68,
               (char (*) [122])
               "( int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
               ,pSVar10);
    sVar2 = local_5c8.content.size_;
    pcVar1 = local_5c8.content.ptr;
    if ((SegmentBuilder *)local_5c8.content.ptr != (SegmentBuilder *)0x0) {
      local_5c8.content.ptr = (char *)0x0;
      local_5c8.content.size_ = 0;
      (**(local_5c8.content.disposer)->_vptr_ArrayDisposer)
                (local_5c8.content.disposer,pcVar1,1,sVar2,sVar2,0,pcVar8,pSVar10,pCVar16,puVar11,
                 pWVar19,uVar13);
    }
    sVar2 = local_600.branches.size_;
    pBVar3 = local_600.branches.ptr;
    if (local_600.branches.ptr != (Branch *)0x0) {
      local_600.branches.ptr = (Branch *)0x0;
      local_600.branches.size_ = 0;
      (**(local_600.branches.disposer)->_vptr_ArrayDisposer)
                (local_600.branches.disposer,pBVar3,0x40,sVar2,sVar2,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    }
    sVar2 = local_600.text.content.size_;
    pcVar1 = local_600.text.content.ptr;
    if ((CapTableBuilder *)local_600.text.content.ptr != (CapTableBuilder *)0x0) {
      local_600.text.content.ptr = (char *)0x0;
      local_600.text.content.size_ = 0;
      (**(local_600.text.content.disposer)->_vptr_ArrayDisposer)
                (local_600.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
    }
  }
  pCVar16 = pCVar17;
  pWVar19 = pWVar18;
  if (pCVar17 != (CapTableBuilder *)0x0) {
    pCVar16 = (CapTableBuilder *)0x0;
    pWVar19 = (WirePointer *)0x0;
    (**(code **)*pWVar14)(pWVar14,pCVar17,1,pWVar18,pWVar18,0);
  }
  local_600.text.content.size_ = (size_t)(local_560.pointers + 2);
  local_600.size_ = (size_t)local_560.segment;
  local_600.text.content.ptr = (char *)local_560.capTable;
  PointerBuilder::initStructList
            ((ListBuilder *)&stack0xfffffffffffffa68,(PointerBuilder *)&local_600,0,(StructSize)0x1)
  ;
  local_538.content.ptr =
       "( list8 = [],\n  int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
  ;
  pSStack_268 = local_560.segment;
  pCStack_260 = local_560.capTable;
  puStack_258 = (undefined2 *)local_560.data;
  pWStack_250 = local_560.pointers;
  local_248 = local_560.dataSize;
  SStack_244 = local_560.pointerCount;
  uStack_242 = local_560._38_2_;
  local_270 = 0x6eba08;
  uVar7 = 0x6eba08;
  value_05.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa58;
  value_05.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffa50;
  value_05.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa60;
  value_05.builder.data = pSVar15;
  value_05.builder.pointers = (WirePointer *)pCVar16;
  value_05.builder._32_8_ = pWVar19;
  pSVar9 = local_560.segment;
  pCVar17 = local_560.capTable;
  puVar11 = (undefined2 *)local_560.data;
  pWVar18 = local_560.pointers;
  uVar13 = local_560._32_8_;
  prettyPrint(value_05);
  kj::StringTree::flatten(&local_5c8,&local_600);
  kj::_::DebugExpression<char_const(&)[136]>::operator==
            ((DebugComparison<const_char_(&)[136],_kj::String> *)&stack0xfffffffffffffa68,
             (DebugExpression<char_const(&)[136]> *)&local_538,&local_5c8);
  sVar2 = local_5c8.content.size_;
  pcVar1 = local_5c8.content.ptr;
  if ((SegmentBuilder *)local_5c8.content.ptr != (SegmentBuilder *)0x0) {
    local_5c8.content.ptr = (char *)0x0;
    local_5c8.content.size_ = 0;
    (**(local_5c8.content.disposer)->_vptr_ArrayDisposer)
              (local_5c8.content.disposer,pcVar1,1,sVar2,sVar2,0,uVar7,pSVar9,pCVar17,puVar11,
               pWVar18,uVar13);
  }
  sVar2 = local_600.branches.size_;
  pBVar3 = local_600.branches.ptr;
  if (local_600.branches.ptr != (Branch *)0x0) {
    local_600.branches.ptr = (Branch *)0x0;
    local_600.branches.size_ = 0;
    (**(local_600.branches.disposer)->_vptr_ArrayDisposer)
              (local_600.branches.disposer,pBVar3,0x40,sVar2,sVar2,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar2 = local_600.text.content.size_;
  pcVar1 = local_600.text.content.ptr;
  if ((CapTableBuilder *)local_600.text.content.ptr != (CapTableBuilder *)0x0) {
    local_600.text.content.ptr = (char *)0x0;
    local_600.text.content.size_ = 0;
    (**(local_600.text.content.disposer)->_vptr_ArrayDisposer)
              (local_600.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((local_568 == false) && (kj::_::Debug::minSeverity < 3)) {
    pSStack_298 = local_560.segment;
    pCStack_290 = local_560.capTable;
    puStack_288 = (undefined2 *)local_560.data;
    pWStack_280 = local_560.pointers;
    local_278 = local_560.dataSize;
    SStack_274 = local_560.pointerCount;
    uStack_272 = local_560._38_2_;
    local_2a0 = 0x6eba08;
    value_06.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa58;
    value_06.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffa50;
    value_06.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa60;
    value_06.builder.data = pSVar15;
    value_06.builder.pointers = (WirePointer *)pCVar16;
    value_06.builder._32_8_ = pWVar19;
    pCVar17 = local_560.capTable;
    puVar11 = (undefined2 *)local_560.data;
    pWVar18 = local_560.pointers;
    uVar13 = local_560._32_8_;
    prettyPrint(value_06);
    pSVar10 = &local_5c8;
    kj::StringTree::flatten(pSVar10,&local_600);
    pcVar8 = 
    "( list8 = [],\n  int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
    ;
    kj::_::Debug::
    log<char_const(&)[206],kj::_::DebugComparison<char_const(&)[136],kj::String>&,char_const(&)[136],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x213,ERROR,
               "\"failed: expected \" \"(\\\"( list8 = [],\\\\n\\\" \\\"  int32ListList = [\\\\n\\\" \\\"    [123, 456, 789, 1234567890],\\\\n\\\" \\\"    [234, 567, 891, 1234567890],\\\\n\\\" \\\"    [345, 678, 912, 1234567890] ] )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( list8 = [],\\n\" \"  int32ListList = [\\n\" \"    [123, 456, 789, 1234567890],\\n\" \"    [234, 567, 891, 1234567890],\\n\" \"    [345, 678, 912, 1234567890] ] )\", prettyPrint(root).flatten()"
               ,(char (*) [206])
                "failed: expected (\"( list8 = [],\\n\" \"  int32ListList = [\\n\" \"    [123, 456, 789, 1234567890],\\n\" \"    [234, 567, 891, 1234567890],\\n\" \"    [345, 678, 912, 1234567890] ] )\") == (prettyPrint(root).flatten())"
               ,(DebugComparison<const_char_(&)[136],_kj::String> *)&stack0xfffffffffffffa68,
               (char (*) [136])
               "( list8 = [],\n  int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
               ,pSVar10);
    sVar2 = local_5c8.content.size_;
    pcVar1 = local_5c8.content.ptr;
    if ((SegmentBuilder *)local_5c8.content.ptr != (SegmentBuilder *)0x0) {
      local_5c8.content.ptr = (char *)0x0;
      local_5c8.content.size_ = 0;
      (**(local_5c8.content.disposer)->_vptr_ArrayDisposer)
                (local_5c8.content.disposer,pcVar1,1,sVar2,sVar2,0,pcVar8,pSVar10,pCVar17,puVar11,
                 pWVar18,uVar13);
    }
    sVar2 = local_600.branches.size_;
    pBVar3 = local_600.branches.ptr;
    if (local_600.branches.ptr != (Branch *)0x0) {
      local_600.branches.ptr = (Branch *)0x0;
      local_600.branches.size_ = 0;
      (**(local_600.branches.disposer)->_vptr_ArrayDisposer)
                (local_600.branches.disposer,pBVar3,0x40,sVar2,sVar2,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    }
    sVar2 = local_600.text.content.size_;
    pcVar1 = local_600.text.content.ptr;
    if ((CapTableBuilder *)local_600.text.content.ptr != (CapTableBuilder *)0x0) {
      local_600.text.content.ptr = (char *)0x0;
      local_600.text.content.size_ = 0;
      (**(local_600.text.content.disposer)->_vptr_ArrayDisposer)
                (local_600.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
    }
  }
  if (pCVar16 != (CapTableBuilder *)0x0) {
    (**(code **)*pWVar14)(pWVar14,pCVar16,1,pWVar19,pWVar19,0);
  }
  pWVar19 = local_560.pointers + 2;
  pSVar15 = local_560.segment;
  pCVar16 = local_560.capTable;
  PointerBuilder::initStructList
            ((ListBuilder *)&local_5c8,(PointerBuilder *)&stack0xfffffffffffffa68,1,(StructSize)0x1)
  ;
  ListBuilder::getStructElement
            ((StructBuilder *)&stack0xfffffffffffffa68,(ListBuilder *)&local_5c8,0);
  *(undefined1 *)&(pWVar19->offsetAndKind).value = 0xc;
  local_4f8 = 
  "( list8 = [(f = 12)],\n  int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
  ;
  pSStack_2c8 = local_560.segment;
  pCStack_2c0 = local_560.capTable;
  puStack_2b8 = (undefined2 *)local_560.data;
  pWStack_2b0 = local_560.pointers;
  local_2a8 = local_560.dataSize;
  SStack_2a4 = local_560.pointerCount;
  uStack_2a2 = local_560._38_2_;
  local_2d0 = 0x6eba08;
  uVar7 = 0x6eba08;
  value_07.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa58;
  value_07.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffa50;
  value_07.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa60;
  value_07.builder.data = pSVar15;
  value_07.builder.pointers = (WirePointer *)pCVar16;
  value_07.builder._32_8_ = pWVar19;
  pSVar9 = local_560.segment;
  pCVar17 = local_560.capTable;
  puVar11 = (undefined2 *)local_560.data;
  pWVar18 = local_560.pointers;
  uVar13 = local_560._32_8_;
  prettyPrint(value_07);
  kj::StringTree::flatten(&local_538,&local_600);
  kj::_::DebugExpression<char_const(&)[144]>::operator==
            ((DebugComparison<const_char_(&)[144],_kj::String> *)&stack0xfffffffffffffa68,
             (DebugExpression<char_const(&)[144]> *)&local_4f8,&local_538);
  sVar2 = local_538.content.size_;
  pcVar1 = local_538.content.ptr;
  if (local_538.content.ptr != (char *)0x0) {
    local_538.content.ptr = (char *)0x0;
    local_538.content.size_ = 0;
    (**(local_538.content.disposer)->_vptr_ArrayDisposer)
              (local_538.content.disposer,pcVar1,1,sVar2,sVar2,0,uVar7,pSVar9,pCVar17,puVar11,
               pWVar18,uVar13);
  }
  sVar2 = local_600.branches.size_;
  pBVar3 = local_600.branches.ptr;
  if (local_600.branches.ptr != (Branch *)0x0) {
    local_600.branches.ptr = (Branch *)0x0;
    local_600.branches.size_ = 0;
    (**(local_600.branches.disposer)->_vptr_ArrayDisposer)
              (local_600.branches.disposer,pBVar3,0x40,sVar2,sVar2,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar2 = local_600.text.content.size_;
  pcVar1 = local_600.text.content.ptr;
  if ((CapTableBuilder *)local_600.text.content.ptr != (CapTableBuilder *)0x0) {
    local_600.text.content.ptr = (char *)0x0;
    local_600.text.content.size_ = 0;
    (**(local_600.text.content.disposer)->_vptr_ArrayDisposer)
              (local_600.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((local_568 == false) && (kj::_::Debug::minSeverity < 3)) {
    pSStack_2f8 = local_560.segment;
    pCStack_2f0 = local_560.capTable;
    puStack_2e8 = (undefined2 *)local_560.data;
    pWStack_2e0 = local_560.pointers;
    local_2d8 = local_560.dataSize;
    SStack_2d4 = local_560.pointerCount;
    uStack_2d2 = local_560._38_2_;
    local_300 = 0x6eba08;
    value_08.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa58;
    value_08.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffa50;
    value_08.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa60;
    value_08.builder.data = pSVar15;
    value_08.builder.pointers = (WirePointer *)pCVar16;
    value_08.builder._32_8_ = pWVar19;
    pCVar17 = local_560.capTable;
    puVar11 = (undefined2 *)local_560.data;
    pWVar18 = local_560.pointers;
    uVar13 = local_560._32_8_;
    prettyPrint(value_08);
    pSVar10 = &local_538;
    kj::StringTree::flatten(pSVar10,&local_600);
    pcVar8 = 
    "( list8 = [(f = 12)],\n  int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
    ;
    kj::_::Debug::
    log<char_const(&)[214],kj::_::DebugComparison<char_const(&)[144],kj::String>&,char_const(&)[144],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x21e,ERROR,
               "\"failed: expected \" \"(\\\"( list8 = [(f = 12)],\\\\n\\\" \\\"  int32ListList = [\\\\n\\\" \\\"    [123, 456, 789, 1234567890],\\\\n\\\" \\\"    [234, 567, 891, 1234567890],\\\\n\\\" \\\"    [345, 678, 912, 1234567890] ] )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( list8 = [(f = 12)],\\n\" \"  int32ListList = [\\n\" \"    [123, 456, 789, 1234567890],\\n\" \"    [234, 567, 891, 1234567890],\\n\" \"    [345, 678, 912, 1234567890] ] )\", prettyPrint(root).flatten()"
               ,(char (*) [214])
                "failed: expected (\"( list8 = [(f = 12)],\\n\" \"  int32ListList = [\\n\" \"    [123, 456, 789, 1234567890],\\n\" \"    [234, 567, 891, 1234567890],\\n\" \"    [345, 678, 912, 1234567890] ] )\") == (prettyPrint(root).flatten())"
               ,(DebugComparison<const_char_(&)[144],_kj::String> *)&stack0xfffffffffffffa68,
               (char (*) [144])
               "( list8 = [(f = 12)],\n  int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
               ,pSVar10);
    sVar2 = local_538.content.size_;
    pcVar1 = local_538.content.ptr;
    if (local_538.content.ptr != (char *)0x0) {
      local_538.content.ptr = (char *)0x0;
      local_538.content.size_ = 0;
      (**(local_538.content.disposer)->_vptr_ArrayDisposer)
                (local_538.content.disposer,pcVar1,1,sVar2,sVar2,0,pcVar8,pSVar10,pCVar17,puVar11,
                 pWVar18,uVar13);
    }
    sVar2 = local_600.branches.size_;
    pBVar3 = local_600.branches.ptr;
    if (local_600.branches.ptr != (Branch *)0x0) {
      local_600.branches.ptr = (Branch *)0x0;
      local_600.branches.size_ = 0;
      (**(local_600.branches.disposer)->_vptr_ArrayDisposer)
                (local_600.branches.disposer,pBVar3,0x40,sVar2,sVar2,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    }
    sVar2 = local_600.text.content.size_;
    pcVar1 = local_600.text.content.ptr;
    if ((CapTableBuilder *)local_600.text.content.ptr != (CapTableBuilder *)0x0) {
      local_600.text.content.ptr = (char *)0x0;
      local_600.text.content.size_ = 0;
      (**(local_600.text.content.disposer)->_vptr_ArrayDisposer)
                (local_600.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
    }
  }
  pCVar17 = pCVar16;
  local_5c8.content.disposer = (ArrayDisposer *)pWVar19;
  if (pCVar16 != (CapTableBuilder *)0x0) {
    pCVar17 = (CapTableBuilder *)0x0;
    pWVar18 = (WirePointer *)0x0;
    (**(code **)*pWVar14)(pWVar14,pCVar16,1,pWVar19,pWVar19,0);
    local_5c8.content.disposer = (ArrayDisposer *)pWVar18;
  }
  local_600.text.content.size_ = (size_t)(local_560.pointers + 2);
  local_600.size_ = (size_t)local_560.segment;
  local_600.text.content.ptr = (char *)local_560.capTable;
  PointerBuilder::initStructList
            ((ListBuilder *)&stack0xfffffffffffffa68,(PointerBuilder *)&local_600,2,(StructSize)0x1)
  ;
  local_5c8.content.size_ = (size_t)pCVar17;
  local_5c8.content.ptr = (char *)pSVar15;
  pSVar15 = (SegmentBuilder *)local_5c8.content.ptr;
  pCVar16 = (CapTableBuilder *)local_5c8.content.size_;
  pWVar19 = (WirePointer *)local_5c8.content.disposer;
  pWVar20 = pWVar14;
  ListBuilder::getStructElement
            ((StructBuilder *)&stack0xfffffffffffffa68,(ListBuilder *)&local_5c8,0);
  *(undefined1 *)&(pWVar19->offsetAndKind).value = 0xc;
  ListBuilder::getStructElement
            ((StructBuilder *)&stack0xfffffffffffffa68,(ListBuilder *)&local_5c8,1);
  *(undefined1 *)&(pWVar19->offsetAndKind).value = 0x22;
  local_4f8 = 
  "( list8 = [(f = 12), (f = 34)],\n  int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
  ;
  pSStack_328 = local_560.segment;
  pCStack_320 = local_560.capTable;
  puStack_318 = (undefined2 *)local_560.data;
  pWStack_310 = local_560.pointers;
  local_308 = local_560.dataSize;
  SStack_304 = local_560.pointerCount;
  uStack_302 = local_560._38_2_;
  local_330 = 0x6eba08;
  uVar7 = 0x6eba08;
  value_09.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa88;
  value_09.schema.super_Schema.raw = (Schema)(Schema)pWVar14;
  value_09.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa60;
  value_09.builder.data = pSVar15;
  value_09.builder.pointers = (WirePointer *)pCVar16;
  value_09.builder._32_8_ = pWVar19;
  pSVar9 = local_560.segment;
  pCVar17 = local_560.capTable;
  puVar11 = (undefined2 *)local_560.data;
  pWVar18 = local_560.pointers;
  uVar13 = local_560._32_8_;
  prettyPrint(value_09);
  kj::StringTree::flatten(&local_538,&local_600);
  kj::_::DebugExpression<char_const(&)[154]>::operator==
            ((DebugComparison<const_char_(&)[154],_kj::String> *)&stack0xfffffffffffffa68,
             (DebugExpression<char_const(&)[154]> *)&local_4f8,&local_538);
  sVar2 = local_538.content.size_;
  pcVar1 = local_538.content.ptr;
  if (local_538.content.ptr != (char *)0x0) {
    local_538.content.ptr = (char *)0x0;
    local_538.content.size_ = 0;
    (**(local_538.content.disposer)->_vptr_ArrayDisposer)
              (local_538.content.disposer,pcVar1,1,sVar2,sVar2,0,uVar7,pSVar9,pCVar17,puVar11,
               pWVar18,uVar13);
  }
  sVar2 = local_600.branches.size_;
  pBVar3 = local_600.branches.ptr;
  if (local_600.branches.ptr != (Branch *)0x0) {
    local_600.branches.ptr = (Branch *)0x0;
    local_600.branches.size_ = 0;
    (**(local_600.branches.disposer)->_vptr_ArrayDisposer)
              (local_600.branches.disposer,pBVar3,0x40,sVar2,sVar2,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar2 = local_600.text.content.size_;
  pcVar1 = local_600.text.content.ptr;
  if ((CapTableBuilder *)local_600.text.content.ptr != (CapTableBuilder *)0x0) {
    local_600.text.content.ptr = (char *)0x0;
    local_600.text.content.size_ = 0;
    (**(local_600.text.content.disposer)->_vptr_ArrayDisposer)
              (local_600.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((local_568 == false) && (kj::_::Debug::minSeverity < 3)) {
    pSStack_358 = local_560.segment;
    pCStack_350 = local_560.capTable;
    puStack_348 = (undefined2 *)local_560.data;
    pWStack_340 = local_560.pointers;
    local_338 = local_560.dataSize;
    SStack_334 = local_560.pointerCount;
    uStack_332 = local_560._38_2_;
    local_360 = 0x6eba08;
    value_10.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa88;
    value_10.schema.super_Schema.raw = (Schema)(Schema)pWVar14;
    value_10.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa60;
    value_10.builder.data = pSVar15;
    value_10.builder.pointers = (WirePointer *)pCVar16;
    value_10.builder._32_8_ = pWVar19;
    pCVar17 = local_560.capTable;
    puVar11 = (undefined2 *)local_560.data;
    pWVar18 = local_560.pointers;
    uVar13 = local_560._32_8_;
    prettyPrint(value_10);
    pSVar10 = &local_538;
    kj::StringTree::flatten(pSVar10,&local_600);
    pcVar8 = 
    "( list8 = [(f = 12), (f = 34)],\n  int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
    ;
    kj::_::Debug::
    log<char_const(&)[224],kj::_::DebugComparison<char_const(&)[154],kj::String>&,char_const(&)[154],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x22a,ERROR,
               "\"failed: expected \" \"(\\\"( list8 = [(f = 12), (f = 34)],\\\\n\\\" \\\"  int32ListList = [\\\\n\\\" \\\"    [123, 456, 789, 1234567890],\\\\n\\\" \\\"    [234, 567, 891, 1234567890],\\\\n\\\" \\\"    [345, 678, 912, 1234567890] ] )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( list8 = [(f = 12), (f = 34)],\\n\" \"  int32ListList = [\\n\" \"    [123, 456, 789, 1234567890],\\n\" \"    [234, 567, 891, 1234567890],\\n\" \"    [345, 678, 912, 1234567890] ] )\", prettyPrint(root).flatten()"
               ,(char (*) [224])
                "failed: expected (\"( list8 = [(f = 12), (f = 34)],\\n\" \"  int32ListList = [\\n\" \"    [123, 456, 789, 1234567890],\\n\" \"    [234, 567, 891, 1234567890],\\n\" \"    [345, 678, 912, 1234567890] ] )\") == (prettyPrint(root).flatten())"
               ,(DebugComparison<const_char_(&)[154],_kj::String> *)&stack0xfffffffffffffa68,
               (char (*) [154])
               "( list8 = [(f = 12), (f = 34)],\n  int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
               ,pSVar10);
    sVar2 = local_538.content.size_;
    pcVar1 = local_538.content.ptr;
    if (local_538.content.ptr != (char *)0x0) {
      local_538.content.ptr = (char *)0x0;
      local_538.content.size_ = 0;
      (**(local_538.content.disposer)->_vptr_ArrayDisposer)
                (local_538.content.disposer,pcVar1,1,sVar2,sVar2,0,pcVar8,pSVar10,pCVar17,puVar11,
                 pWVar18,uVar13);
    }
    sVar2 = local_600.branches.size_;
    pBVar3 = local_600.branches.ptr;
    if (local_600.branches.ptr != (Branch *)0x0) {
      local_600.branches.ptr = (Branch *)0x0;
      local_600.branches.size_ = 0;
      (**(local_600.branches.disposer)->_vptr_ArrayDisposer)
                (local_600.branches.disposer,pBVar3,0x40,sVar2,sVar2,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    }
    sVar2 = local_600.text.content.size_;
    pcVar1 = local_600.text.content.ptr;
    if ((CapTableBuilder *)local_600.text.content.ptr != (CapTableBuilder *)0x0) {
      local_600.text.content.ptr = (char *)0x0;
      local_600.text.content.size_ = 0;
      (**(local_600.text.content.disposer)->_vptr_ArrayDisposer)
                (local_600.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
    }
  }
  if (pCVar16 != (CapTableBuilder *)0x0) {
    (**(code **)*pWVar20)(pWVar20,pCVar16,1,pWVar19,pWVar19,0);
  }
  MessageBuilder::getRootInternal((Builder *)&local_600,&local_120.super_MessageBuilder);
  PointerBuilder::initStruct
            (&local_560,(PointerBuilder *)&stack0xfffffffffffffa68,(StructSize)0x10001);
  *(undefined2 *)local_560.data = 0;
  pSVar15 = local_560.segment;
  pCVar16 = local_560.capTable;
  pWVar19 = local_560.pointers;
  PointerBuilder::initStruct
            ((StructBuilder *)local_520,(PointerBuilder *)&stack0xfffffffffffffa68,
             (StructSize)0x20000);
  local_538.content.ptr = "(un = (struct = ()))";
  pSStack_388 = local_560.segment;
  pCStack_380 = local_560.capTable;
  puStack_378 = (undefined2 *)local_560.data;
  pWStack_370 = local_560.pointers;
  local_368 = local_560.dataSize;
  SStack_364 = local_560.pointerCount;
  uStack_362 = local_560._38_2_;
  local_390 = 0x6ec6e0;
  uVar7 = 0x6ec6e0;
  value_11.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa88;
  value_11.schema.super_Schema.raw = (Schema)(Schema)pWVar14;
  value_11.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa60;
  value_11.builder.data = pSVar15;
  value_11.builder.pointers = (WirePointer *)pCVar16;
  value_11.builder._32_8_ = pWVar19;
  pSVar9 = local_560.segment;
  pCVar17 = local_560.capTable;
  puVar11 = (undefined2 *)local_560.data;
  pWVar18 = local_560.pointers;
  uVar13 = local_560._32_8_;
  prettyPrint(value_11);
  kj::StringTree::flatten(&local_5c8,&local_600);
  kj::_::DebugExpression<char_const(&)[21]>::operator==
            ((DebugComparison<const_char_(&)[21],_kj::String> *)&stack0xfffffffffffffa68,
             (DebugExpression<char_const(&)[21]> *)&local_538,&local_5c8);
  sVar2 = local_5c8.content.size_;
  pcVar1 = local_5c8.content.ptr;
  if ((SegmentBuilder *)local_5c8.content.ptr != (SegmentBuilder *)0x0) {
    local_5c8.content.ptr = (char *)0x0;
    local_5c8.content.size_ = 0;
    (**(code **)*(WirePointer *)local_5c8.content.disposer)
              (local_5c8.content.disposer,pcVar1,1,sVar2,sVar2,0,uVar7,pSVar9,pCVar17,puVar11,
               pWVar18,uVar13);
  }
  sVar2 = local_600.branches.size_;
  pBVar3 = local_600.branches.ptr;
  if (local_600.branches.ptr != (Branch *)0x0) {
    local_600.branches.ptr = (Branch *)0x0;
    local_600.branches.size_ = 0;
    (**(local_600.branches.disposer)->_vptr_ArrayDisposer)
              (local_600.branches.disposer,pBVar3,0x40,sVar2,sVar2,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar2 = local_600.text.content.size_;
  pcVar1 = local_600.text.content.ptr;
  if ((CapTableBuilder *)local_600.text.content.ptr != (CapTableBuilder *)0x0) {
    local_600.text.content.ptr = (char *)0x0;
    local_600.text.content.size_ = 0;
    (**(local_600.text.content.disposer)->_vptr_ArrayDisposer)
              (local_600.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((local_568 == false) && (kj::_::Debug::minSeverity < 3)) {
    pSStack_3b8 = local_560.segment;
    pCStack_3b0 = local_560.capTable;
    puStack_3a8 = (undefined2 *)local_560.data;
    pWStack_3a0 = local_560.pointers;
    local_398 = local_560.dataSize;
    SStack_394 = local_560.pointerCount;
    uStack_392 = local_560._38_2_;
    local_3c0 = 0x6ec6e0;
    value_12.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa88;
    value_12.schema.super_Schema.raw = (Schema)(Schema)pWVar14;
    value_12.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa60;
    value_12.builder.data = pSVar15;
    value_12.builder.pointers = (WirePointer *)pCVar16;
    value_12.builder._32_8_ = pWVar19;
    pCVar17 = local_560.capTable;
    puVar11 = (undefined2 *)local_560.data;
    pWVar18 = local_560.pointers;
    uVar13 = local_560._32_8_;
    prettyPrint(value_12);
    pSVar10 = &local_5c8;
    kj::StringTree::flatten(pSVar10,&local_600);
    pcVar8 = "(un = (struct = ()))";
    kj::_::Debug::
    log<char_const(&)[75],kj::_::DebugComparison<char_const(&)[21],kj::String>&,char_const(&)[21],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x233,ERROR,
               "\"failed: expected \" \"(\\\"(un = (struct = ()))\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"(un = (struct = ()))\", prettyPrint(root).flatten()"
               ,(char (*) [75])
                "failed: expected (\"(un = (struct = ()))\") == (prettyPrint(root).flatten())",
               (DebugComparison<const_char_(&)[21],_kj::String> *)&stack0xfffffffffffffa68,
               (char (*) [21])"(un = (struct = ()))",pSVar10);
    sVar2 = local_5c8.content.size_;
    pcVar1 = local_5c8.content.ptr;
    if ((SegmentBuilder *)local_5c8.content.ptr != (SegmentBuilder *)0x0) {
      local_5c8.content.ptr = (char *)0x0;
      local_5c8.content.size_ = 0;
      (**(code **)*(WirePointer *)local_5c8.content.disposer)
                (local_5c8.content.disposer,pcVar1,1,sVar2,sVar2,0,pcVar8,pSVar10,pCVar17,puVar11,
                 pWVar18,uVar13);
    }
    sVar2 = local_600.branches.size_;
    pBVar3 = local_600.branches.ptr;
    if (local_600.branches.ptr != (Branch *)0x0) {
      local_600.branches.ptr = (Branch *)0x0;
      local_600.branches.size_ = 0;
      (**(local_600.branches.disposer)->_vptr_ArrayDisposer)
                (local_600.branches.disposer,pBVar3,0x40,sVar2,sVar2,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    }
    sVar2 = local_600.text.content.size_;
    pcVar1 = local_600.text.content.ptr;
    if ((CapTableBuilder *)local_600.text.content.ptr != (CapTableBuilder *)0x0) {
      local_600.text.content.ptr = (char *)0x0;
      local_600.text.content.size_ = 0;
      (**(local_600.text.content.disposer)->_vptr_ArrayDisposer)
                (local_600.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
    }
  }
  if (pCVar16 != (CapTableBuilder *)0x0) {
    (**(code **)*pWVar20)(pWVar20,pCVar16,1,pWVar19,pWVar19,0);
  }
  value_23.super_StringPtr.content.size_ = 4;
  value_23.super_StringPtr.content.ptr = "foo";
  pSVar15 = (SegmentBuilder *)local_520._0_8_;
  pCVar16 = (CapTableBuilder *)local_520._8_8_;
  pWVar19 = (WirePointer *)local_520._24_8_;
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&stack0xfffffffffffffa68,value_23);
  local_538.content.ptr = "( un = (\n    struct = (someText = \"foo\") ) )";
  pSStack_3e8 = local_560.segment;
  pCStack_3e0 = local_560.capTable;
  puStack_3d8 = (undefined2 *)local_560.data;
  pWStack_3d0 = local_560.pointers;
  local_3c8 = local_560.dataSize;
  SStack_3c4 = local_560.pointerCount;
  uStack_3c2 = local_560._38_2_;
  local_3f0 = 0x6ec6e0;
  uVar7 = 0x6ec6e0;
  value_13.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa88;
  value_13.schema.super_Schema.raw = (Schema)(Schema)pWVar14;
  value_13.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa60;
  value_13.builder.data = pSVar15;
  value_13.builder.pointers = (WirePointer *)pCVar16;
  value_13.builder._32_8_ = pWVar19;
  pSVar9 = local_560.segment;
  pCVar17 = local_560.capTable;
  puVar11 = (undefined2 *)local_560.data;
  pWVar18 = local_560.pointers;
  uVar13 = local_560._32_8_;
  prettyPrint(value_13);
  kj::StringTree::flatten(&local_5c8,&local_600);
  kj::_::DebugExpression<char_const(&)[45]>::operator==
            ((DebugComparison<const_char_(&)[45],_kj::String> *)&stack0xfffffffffffffa68,
             (DebugExpression<char_const(&)[45]> *)&local_538,&local_5c8);
  sVar2 = local_5c8.content.size_;
  pcVar1 = local_5c8.content.ptr;
  if ((SegmentBuilder *)local_5c8.content.ptr != (SegmentBuilder *)0x0) {
    local_5c8.content.ptr = (char *)0x0;
    local_5c8.content.size_ = 0;
    (**(code **)*(WirePointer *)local_5c8.content.disposer)
              (local_5c8.content.disposer,pcVar1,1,sVar2,sVar2,0,uVar7,pSVar9,pCVar17,puVar11,
               pWVar18,uVar13);
  }
  sVar2 = local_600.branches.size_;
  pBVar3 = local_600.branches.ptr;
  if (local_600.branches.ptr != (Branch *)0x0) {
    local_600.branches.ptr = (Branch *)0x0;
    local_600.branches.size_ = 0;
    (**(local_600.branches.disposer)->_vptr_ArrayDisposer)
              (local_600.branches.disposer,pBVar3,0x40,sVar2,sVar2,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar2 = local_600.text.content.size_;
  pcVar1 = local_600.text.content.ptr;
  if ((CapTableBuilder *)local_600.text.content.ptr != (CapTableBuilder *)0x0) {
    local_600.text.content.ptr = (char *)0x0;
    local_600.text.content.size_ = 0;
    (**(local_600.text.content.disposer)->_vptr_ArrayDisposer)
              (local_600.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((local_568 == false) && (kj::_::Debug::minSeverity < 3)) {
    pSStack_418 = local_560.segment;
    pCStack_410 = local_560.capTable;
    puStack_408 = (undefined2 *)local_560.data;
    pWStack_400 = local_560.pointers;
    local_3f8 = local_560.dataSize;
    SStack_3f4 = local_560.pointerCount;
    uStack_3f2 = local_560._38_2_;
    local_420 = 0x6ec6e0;
    value_14.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa88;
    value_14.schema.super_Schema.raw = (Schema)(Schema)pWVar14;
    value_14.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa60;
    value_14.builder.data = pSVar15;
    value_14.builder.pointers = (WirePointer *)pCVar16;
    value_14.builder._32_8_ = pWVar19;
    pCVar17 = local_560.capTable;
    puVar11 = (undefined2 *)local_560.data;
    pWVar18 = local_560.pointers;
    uVar13 = local_560._32_8_;
    prettyPrint(value_14);
    pSVar10 = &local_5c8;
    kj::StringTree::flatten(pSVar10,&local_600);
    pcVar8 = "( un = (\n    struct = (someText = \"foo\") ) )";
    kj::_::Debug::
    log<char_const(&)[105],kj::_::DebugComparison<char_const(&)[45],kj::String>&,char_const(&)[45],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x239,ERROR,
               "\"failed: expected \" \"(\\\"( un = (\\\\n\\\" \\\"    struct = (someText = \\\\\\\"foo\\\\\\\") ) )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( un = (\\n\" \"    struct = (someText = \\\"foo\\\") ) )\", prettyPrint(root).flatten()"
               ,(char (*) [105])
                "failed: expected (\"( un = (\\n\" \"    struct = (someText = \\\"foo\\\") ) )\") == (prettyPrint(root).flatten())"
               ,(DebugComparison<const_char_(&)[45],_kj::String> *)&stack0xfffffffffffffa68,
               (char (*) [45])"( un = (\n    struct = (someText = \"foo\") ) )",pSVar10);
    sVar2 = local_5c8.content.size_;
    pcVar1 = local_5c8.content.ptr;
    if ((SegmentBuilder *)local_5c8.content.ptr != (SegmentBuilder *)0x0) {
      local_5c8.content.ptr = (char *)0x0;
      local_5c8.content.size_ = 0;
      (**(code **)*(WirePointer *)local_5c8.content.disposer)
                (local_5c8.content.disposer,pcVar1,1,sVar2,sVar2,0,pcVar8,pSVar10,pCVar17,puVar11,
                 pWVar18,uVar13);
    }
    sVar2 = local_600.branches.size_;
    pBVar3 = local_600.branches.ptr;
    if (local_600.branches.ptr != (Branch *)0x0) {
      local_600.branches.ptr = (Branch *)0x0;
      local_600.branches.size_ = 0;
      (**(local_600.branches.disposer)->_vptr_ArrayDisposer)
                (local_600.branches.disposer,pBVar3,0x40,sVar2,sVar2,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    }
    sVar2 = local_600.text.content.size_;
    pcVar1 = local_600.text.content.ptr;
    if ((CapTableBuilder *)local_600.text.content.ptr != (CapTableBuilder *)0x0) {
      local_600.text.content.ptr = (char *)0x0;
      local_600.text.content.size_ = 0;
      (**(local_600.text.content.disposer)->_vptr_ArrayDisposer)
                (local_600.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
    }
  }
  if (pCVar16 != (CapTableBuilder *)0x0) {
    (**(code **)*pWVar20)(pWVar20,pCVar16,1,pWVar19,pWVar19,0);
  }
  pWVar19 = (WirePointer *)(local_520._24_8_ + 8);
  value_24.super_StringPtr.content.size_ = 0x21;
  value_24.super_StringPtr.content.ptr = "baaaaaaaaaaaaaaaaaaaaaaaaaaaaaar";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&stack0xfffffffffffffa68,value_24);
  local_538.content.ptr =
       "( un = (\n    struct = (\n      someText = \"foo\",\n      moreText = \"baaaaaaaaaaaaaaaaaaaaaaaaaaaaaar\" ) ) )"
  ;
  pSStack_448 = local_560.segment;
  pCStack_440 = local_560.capTable;
  puStack_438 = (undefined2 *)local_560.data;
  pWStack_430 = local_560.pointers;
  local_428 = local_560.dataSize;
  SStack_424 = local_560.pointerCount;
  uStack_422 = local_560._38_2_;
  local_450 = 0x6ec6e0;
  uVar7 = 0x6ec6e0;
  value_15.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa88;
  value_15.schema.super_Schema.raw = (Schema)(Schema)pWVar14;
  value_15.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa60;
  value_15.builder.data = (void *)local_520._0_8_;
  value_15.builder.pointers = (WirePointer *)local_520._8_8_;
  value_15.builder._32_8_ = pWVar19;
  pSVar9 = local_560.segment;
  pCVar17 = local_560.capTable;
  puVar11 = (undefined2 *)local_560.data;
  pWVar18 = local_560.pointers;
  uVar13 = local_560._32_8_;
  prettyPrint(value_15);
  kj::StringTree::flatten(&local_5c8,&local_600);
  kj::_::DebugExpression<char_const(&)[106]>::operator==
            ((DebugComparison<const_char_(&)[106],_kj::String> *)&stack0xfffffffffffffa68,
             (DebugExpression<char_const(&)[106]> *)&local_538,&local_5c8);
  sVar2 = local_5c8.content.size_;
  pcVar1 = local_5c8.content.ptr;
  pSVar15 = (SegmentBuilder *)local_520._0_8_;
  pCVar16 = (CapTableBuilder *)local_520._8_8_;
  if ((SegmentBuilder *)local_5c8.content.ptr != (SegmentBuilder *)0x0) {
    local_5c8.content.ptr = (char *)0x0;
    local_5c8.content.size_ = 0;
    (**(code **)*(WirePointer *)local_5c8.content.disposer)
              (local_5c8.content.disposer,pcVar1,1,sVar2,sVar2,0,uVar7,pSVar9,pCVar17,puVar11,
               pWVar18,uVar13);
    pSVar15 = (SegmentBuilder *)local_520._0_8_;
    pCVar16 = (CapTableBuilder *)local_520._8_8_;
  }
  sVar2 = local_600.branches.size_;
  pBVar3 = local_600.branches.ptr;
  if (local_600.branches.ptr != (Branch *)0x0) {
    local_600.branches.ptr = (Branch *)0x0;
    local_600.branches.size_ = 0;
    (**(local_600.branches.disposer)->_vptr_ArrayDisposer)
              (local_600.branches.disposer,pBVar3,0x40,sVar2,sVar2,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar2 = local_600.text.content.size_;
  pcVar1 = local_600.text.content.ptr;
  if ((CapTableBuilder *)local_600.text.content.ptr != (CapTableBuilder *)0x0) {
    local_600.text.content.ptr = (char *)0x0;
    local_600.text.content.size_ = 0;
    (**(local_600.text.content.disposer)->_vptr_ArrayDisposer)
              (local_600.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  if ((local_568 == false) && (kj::_::Debug::minSeverity < 3)) {
    pSStack_478 = local_560.segment;
    pCStack_470 = local_560.capTable;
    puStack_468 = (undefined2 *)local_560.data;
    pWStack_460 = local_560.pointers;
    local_458 = local_560.dataSize;
    SStack_454 = local_560.pointerCount;
    uStack_452 = local_560._38_2_;
    local_480 = 0x6ec6e0;
    value_16.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffa88;
    value_16.schema.super_Schema.raw = (Schema)(Schema)pWVar14;
    value_16.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffa60;
    value_16.builder.data = pSVar15;
    value_16.builder.pointers = (WirePointer *)pCVar16;
    value_16.builder._32_8_ = pWVar19;
    prettyPrint(value_16);
    pSVar10 = &local_5c8;
    kj::StringTree::flatten(pSVar10,&local_600);
    pcVar8 = 
    "( un = (\n    struct = (\n      someText = \"foo\",\n      moreText = \"baaaaaaaaaaaaaaaaaaaaaaaaaaaaaar\" ) ) )"
    ;
    kj::_::Debug::
    log<char_const(&)[176],kj::_::DebugComparison<char_const(&)[106],kj::String>&,char_const(&)[106],kj::String>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x241,ERROR,
               "\"failed: expected \" \"(\\\"( un = (\\\\n\\\" \\\"    struct = (\\\\n\\\" \\\"      someText = \\\\\\\"foo\\\\\\\",\\\\n\\\" \\\"      moreText = \\\\\\\"baaaaaaaaaaaaaaaaaaaaaaaaaaaaaar\\\\\\\" ) ) )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( un = (\\n\" \"    struct = (\\n\" \"      someText = \\\"foo\\\",\\n\" \"      moreText = \\\"baaaaaaaaaaaaaaaaaaaaaaaaaaaaaar\\\" ) ) )\", prettyPrint(root).flatten()"
               ,(char (*) [176])
                "failed: expected (\"( un = (\\n\" \"    struct = (\\n\" \"      someText = \\\"foo\\\",\\n\" \"      moreText = \\\"baaaaaaaaaaaaaaaaaaaaaaaaaaaaaar\\\" ) ) )\") == (prettyPrint(root).flatten())"
               ,(DebugComparison<const_char_(&)[106],_kj::String> *)&stack0xfffffffffffffa68,
               (char (*) [106])
               "( un = (\n    struct = (\n      someText = \"foo\",\n      moreText = \"baaaaaaaaaaaaaaaaaaaaaaaaaaaaaar\" ) ) )"
               ,pSVar10);
    sVar2 = local_5c8.content.size_;
    pcVar1 = local_5c8.content.ptr;
    if ((SegmentBuilder *)local_5c8.content.ptr != (SegmentBuilder *)0x0) {
      local_5c8.content.ptr = (char *)0x0;
      local_5c8.content.size_ = 0;
      (**(code **)*(WirePointer *)local_5c8.content.disposer)
                (local_5c8.content.disposer,pcVar1,1,sVar2,sVar2,0,pcVar8,pSVar10,local_560.capTable
                 ,local_560.data,local_560.pointers,local_560._32_8_);
    }
    sVar2 = local_600.branches.size_;
    pBVar3 = local_600.branches.ptr;
    if (local_600.branches.ptr != (Branch *)0x0) {
      local_600.branches.ptr = (Branch *)0x0;
      local_600.branches.size_ = 0;
      (**(local_600.branches.disposer)->_vptr_ArrayDisposer)
                (local_600.branches.disposer,pBVar3,0x40,sVar2,sVar2,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    }
    sVar2 = local_600.text.content.size_;
    pcVar1 = local_600.text.content.ptr;
    if ((CapTableBuilder *)local_600.text.content.ptr != (CapTableBuilder *)0x0) {
      local_600.text.content.ptr = (char *)0x0;
      local_600.text.content.size_ = 0;
      (**(local_600.text.content.disposer)->_vptr_ArrayDisposer)
                (local_600.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
    }
  }
  if (pCVar16 != (CapTableBuilder *)0x0) {
    (**(code **)*pWVar20)(pWVar20,pCVar16,1,pWVar19,pWVar19,0);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_120);
  return;
}

Assistant:

TEST(Stringify, PrettyPrintAdvanced) {
  MallocMessageBuilder builder;

  {
    auto root = builder.initRoot<test::TestPrintInlineStructs>();

    auto list = root.initStructList(3);
    list[0].setInt32Field(123);
    list[0].setTextField("foo");
    list[1].setInt32Field(456);
    list[1].setTextField("bar");
    list[2].setInt32Field(789);
    list[2].setTextField("baz");

    EXPECT_EQ(
        "( structList = [\n"
        "    (int32Field = 123, textField = \"foo\"),\n"
        "    (int32Field = 456, textField = \"bar\"),\n"
        "    (int32Field = 789, textField = \"baz\") ] )",
        prettyPrint(root).flatten());

    root.setSomeText("foo");

    EXPECT_EQ(
        "( someText = \"foo\",\n"
        "  structList = [\n"
        "    (int32Field = 123, textField = \"foo\"),\n"
        "    (int32Field = 456, textField = \"bar\"),\n"
        "    (int32Field = 789, textField = \"baz\") ] )",
        prettyPrint(root).flatten());
  }

  {
    auto root = builder.initRoot<test::TestLists>();
    auto ll = root.initInt32ListList(3);
    ll.set(0, {123, 456, 789, 1234567890});
    ll.set(1, {234, 567, 891, 1234567890});
    ll.set(2, {345, 678, 912, 1234567890});

    EXPECT_EQ(
        "[ [123, 456, 789, 1234567890],\n"
        "  [234, 567, 891, 1234567890],\n"
        "  [345, 678, 912, 1234567890] ]",
        prettyPrint(ll).flatten());

    EXPECT_EQ(
        "( int32ListList = [\n"
        "    [123, 456, 789, 1234567890],\n"
        "    [234, 567, 891, 1234567890],\n"
        "    [345, 678, 912, 1234567890] ] )",
        prettyPrint(root).flatten());

    root.initList8(0);

    EXPECT_EQ(
        "( list8 = [],\n"
        "  int32ListList = [\n"
        "    [123, 456, 789, 1234567890],\n"
        "    [234, 567, 891, 1234567890],\n"
        "    [345, 678, 912, 1234567890] ] )",
        prettyPrint(root).flatten());

    auto l8 = root.initList8(1);
    l8[0].setF(12);

    EXPECT_EQ(
        "( list8 = [(f = 12)],\n"
        "  int32ListList = [\n"
        "    [123, 456, 789, 1234567890],\n"
        "    [234, 567, 891, 1234567890],\n"
        "    [345, 678, 912, 1234567890] ] )",
        prettyPrint(root).flatten());

    l8 = root.initList8(2);
    l8[0].setF(12);
    l8[1].setF(34);

    EXPECT_EQ(
        "( list8 = [(f = 12), (f = 34)],\n"
        "  int32ListList = [\n"
        "    [123, 456, 789, 1234567890],\n"
        "    [234, 567, 891, 1234567890],\n"
        "    [345, 678, 912, 1234567890] ] )",
        prettyPrint(root).flatten());
  }

  {
    auto root = builder.initRoot<test::TestStructUnion>();

    auto s = root.getUn().initStruct();
    EXPECT_EQ(
        "(un = (struct = ()))",
        prettyPrint(root).flatten());

    s.setSomeText("foo");
    EXPECT_EQ(
        "( un = (\n"
        "    struct = (someText = \"foo\") ) )",
        prettyPrint(root).flatten());

    s.setMoreText("baaaaaaaaaaaaaaaaaaaaaaaaaaaaaar");
    EXPECT_EQ(
        "( un = (\n"
        "    struct = (\n"
        "      someText = \"foo\",\n"
        "      moreText = \"baaaaaaaaaaaaaaaaaaaaaaaaaaaaaar\" ) ) )",
        prettyPrint(root).flatten());
  }
}